

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O2

float crnlib::quadratic(float t,float R)

{
  float fVar1;
  float fVar2;
  
  fVar2 = -t;
  if (-t <= t) {
    fVar2 = t;
  }
  fVar1 = 0.0;
  if (fVar2 < 1.5) {
    if (fVar2 <= 0.5) {
      fVar1 = (R + 1.0) * 0.5 - (R + R) * fVar2 * fVar2;
    }
    else {
      fVar1 = (R + 1.0) * 0.75 + fVar2 * (-0.5 - (R + R)) + fVar2 * fVar2 * R;
    }
  }
  return fVar1;
}

Assistant:

static float quadratic(float t, const float R) {
  if (t < 0.0f)
    t = -t;
  if (t < QUADRATIC_SUPPORT) {
    float tt = t * t;
    if (t <= .5f)
      return (-2.0f * R) * tt + .5f * (R + 1.0f);
    else
      return (R * tt) + (-2.0f * R - .5f) * t + (3.0f / 4.0f) * (R + 1.0f);
  } else
    return 0.0f;
}